

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::DefaultAtomVisitor::visit(DefaultAtomVisitor *this,DirectionalAtom *datom)

{
  AtomType *this_00;
  element_type *peVar1;
  bool bVar2;
  BaseAtomVisitor *this_01;
  RealType RVar3;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomData> atomData;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  GayBerneAdapter gba;
  FluctuatingChargeAdapter fqa;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_118;
  MultipoleAdapter local_108;
  RectMatrix<double,_3U,_3U> local_100;
  FixedChargeAdapter local_b8;
  __shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> local_b0 [8];
  undefined1 local_a8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  Vector<double,_3U> local_90;
  GayBerneAdapter local_78;
  FluctuatingChargeAdapter local_70;
  RotMat3x3d local_68;
  
  local_118._M_ptr = (element_type *)0x0;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128._M_ptr = (element_type *)0x0;
  local_128._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (datom->super_Atom).atomType_;
  bVar2 = BaseAtomVisitor::isVisited(&this->super_BaseAtomVisitor,&datom->super_Atom);
  if (!bVar2) {
    std::make_shared<OpenMD::AtomInfo>();
    std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_128,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100.data_[0] + 1));
    (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_100,datom);
    std::__cxx11::string::operator=((string *)local_128._M_ptr,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    (local_128._M_ptr)->globalID = (datom->super_Atom).super_StuntDouble.globalIndex_;
    StuntDouble::getPos((Vector3d *)&local_100,(StuntDouble *)datom);
    Vector<double,_3U>::operator=
              (&((local_128._M_ptr)->pos).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_100)
    ;
    StuntDouble::getVel((Vector3d *)&local_100,(StuntDouble *)datom);
    Vector<double,_3U>::operator=
              (&((local_128._M_ptr)->vel).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_100)
    ;
    StuntDouble::getFrc((Vector3d *)&local_100,(StuntDouble *)datom);
    Vector<double,_3U>::operator=
              (&((local_128._M_ptr)->frc).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_100)
    ;
    (local_128._M_ptr)->hasVelocity = true;
    (local_128._M_ptr)->hasForce = true;
    (local_128._M_ptr)->hasGlobalID = true;
    local_b8.at_ = this_00;
    bVar2 = FixedChargeAdapter::isFixedCharge(&local_b8);
    if (bVar2) {
      (local_128._M_ptr)->hasCharge = true;
      RVar3 = FixedChargeAdapter::getCharge(&local_b8);
      (local_128._M_ptr)->charge = RVar3;
    }
    local_70.at_ = this_00;
    bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_70);
    if (bVar2) {
      (local_128._M_ptr)->hasCharge = true;
      (local_128._M_ptr)->charge =
           *(double *)
            (*(long *)((long)&(((datom->super_Atom).super_StuntDouble.snapshotMan_)->
                               currentSnapshot_->atomData).flucQPos.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start +
                      (datom->super_Atom).super_StuntDouble.storage_) +
            (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 8) +
           (local_128._M_ptr)->charge;
    }
    if (((this->super_BaseAtomVisitor).storageLayout_ & 0x1000) != 0) {
      bVar2 = AtomType::isElectrostatic(this_00);
      if (bVar2) {
        (local_128._M_ptr)->hasElectricField = true;
        StuntDouble::getElectricField((Vector3d *)&local_100,(StuntDouble *)datom);
        Vector<double,_3U>::operator=
                  (&((local_128._M_ptr)->eField).super_Vector<double,_3U>,
                   (Vector<double,_3U> *)&local_100);
      }
    }
    local_108.at_ = this_00;
    local_78.at_ = this_00;
    bVar2 = GayBerneAdapter::isGayBerne(&local_78);
    if (bVar2) {
      (local_128._M_ptr)->hasVector = true;
      StuntDouble::getA(&local_68,(StuntDouble *)datom);
      SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_100,&local_68);
      operator*(&local_90,&local_100,(Vector<double,_3U> *)OpenMD::V3Z);
      Vector3<double>::operator=(&(local_128._M_ptr)->vec,&local_90);
    }
    else {
      bVar2 = MultipoleAdapter::isDipole(&local_108);
      if (bVar2) {
        (local_128._M_ptr)->hasVector = true;
        StuntDouble::getDipole((Vector3d *)&local_100,(StuntDouble *)datom);
        Vector<double,_3U>::operator=
                  (&((local_128._M_ptr)->vec).super_Vector<double,_3U>,
                   (Vector<double,_3U> *)&local_100);
      }
      else {
        bVar2 = MultipoleAdapter::isQuadrupole(&local_108);
        if (bVar2) {
          (local_128._M_ptr)->hasVector = true;
          StuntDouble::getA(&local_68,(StuntDouble *)datom);
          SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_100,&local_68);
          operator*(&local_90,&local_100,(Vector<double,_3U> *)OpenMD::V3Z);
          Vector3<double>::operator=(&(local_128._M_ptr)->vec,&local_90);
        }
      }
    }
    std::make_shared<OpenMD::AtomData>();
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_118,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_100.data_[0] + 1));
    peVar1 = local_118._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"ATOMDATA",(allocator<char> *)&local_68);
    std::__cxx11::string::_M_assign((string *)&(peVar1->super_GenericData).id_);
    std::__cxx11::string::~string((string *)&local_100);
    peVar1 = local_118._M_ptr;
    std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),
               &local_128);
    std::
    vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
    push_back(&peVar1->data,(value_type *)(local_a8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<OpenMD::AtomData,void>(local_b0,&local_118);
    StuntDouble::addProperty((StuntDouble *)datom,(shared_ptr<OpenMD::GenericData> *)local_b0);
    this_01 = (BaseAtomVisitor *)local_a8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    BaseAtomVisitor::setVisited(this_01,&datom->super_Atom);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  return;
}

Assistant:

void DefaultAtomVisitor::visit(DirectionalAtom* datom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    AtomType* atype = datom->getAtomType();

    if (isVisited(datom)) return;

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = datom->getType();
    atomInfo->globalID     = datom->getGlobalIndex();
    atomInfo->pos          = datom->getPos();
    atomInfo->vel          = datom->getVel();
    atomInfo->frc          = datom->getFrc();
    atomInfo->hasVelocity  = true;
    atomInfo->hasForce     = true;
    atomInfo->hasGlobalID  = true;

    FixedChargeAdapter fca = FixedChargeAdapter(atype);
    if (fca.isFixedCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge    = fca.getCharge();
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
    if (fqa.isFluctuatingCharge()) {
      atomInfo->hasCharge = true;
      atomInfo->charge += datom->getFlucQPos();
    }

    if ((storageLayout_ & DataStorage::dslElectricField) &&
        (atype->isElectrostatic())) {
      atomInfo->hasElectricField = true;
      atomInfo->eField           = datom->getElectricField();
    }

    GayBerneAdapter gba = GayBerneAdapter(atype);
    MultipoleAdapter ma = MultipoleAdapter(atype);

    if (gba.isGayBerne()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    } else if (ma.isDipole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getDipole();
    } else if (ma.isQuadrupole()) {
      atomInfo->hasVector = true;
      atomInfo->vec       = datom->getA().transpose() * V3Z;
    }

    atomData = std::make_shared<AtomData>();
    atomData->setID("ATOMDATA");
    atomData->addAtomInfo(atomInfo);

    datom->addProperty(atomData);

    setVisited(datom);
  }